

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall
Pl_Flate::Pl_Flate(Pl_Flate *this,char *identifier,Pipeline *next,action_e action,
                  uint out_bufsize_int)

{
  logic_error *this_00;
  size_t local_30;
  uint local_28;
  action_e local_24;
  uint out_bufsize_int_local;
  action_e action_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Flate *this_local;
  
  local_28 = out_bufsize_int;
  local_24 = action;
  _out_bufsize_int_local = next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Flate_00590330;
  local_30 = QIntC::to_size<unsigned_int>(&local_28);
  std::make_unique<Pl_Flate::Members,unsigned_long,Pl_Flate::action_e&>
            ((unsigned_long *)&this->m,(action_e *)&local_30);
  if (_out_bufsize_int_local == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_Flate with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

Pl_Flate::Pl_Flate(
    char const* identifier, Pipeline* next, action_e action, unsigned int out_bufsize_int) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(QIntC::to_size(out_bufsize_int), action))
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_Flate with nullptr as next");
    }
}